

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

bool CoreML::hasCoreML6Opsets(Model *model)

{
  Pipeline *pPVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>::KeyValuePair>,_unsigned_long>
  local_40;
  
  if (model->_oneof_case_[0] == 0x1f6) {
    pPVar1 = (model->Type_).pipeline_;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"main","");
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
    ::InnerMap::FindHelper
              (&local_40,(InnerMap *)(pPVar1->names_).super_RepeatedPtrFieldBase.arena_,&local_60,
               (TreeIterator *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (model->_oneof_case_[0] != 0x1f6) {
      Specification::MILSpec::Program::default_instance();
    }
    if ((local_40.first.node_ != (Node *)0x0) &&
       (iVar2 = std::__cxx11::string::compare
                          ((char *)((((local_40.first.node_)->kv).v_)->second).opset_.ptr_),
       iVar2 == 0)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool CoreML::hasCoreML6Opsets(const Specification::Model& model) {
    if (model.Type_case() == Specification::Model::kMlProgram) {
        auto main_iter = model.mlprogram().functions().find("main");
        if (main_iter != model.mlprogram().functions().end()) {
            const auto& main = main_iter->second;
            if (main.opset() == "CoreML6") {
                return true;
            }
        }
    }
    return false;
}